

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O1

uint16_t __thiscall create::Packet::getData(Packet *this)

{
  uint16_t uVar1;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->dataMutex);
  if (iVar2 == 0) {
    uVar1 = this->data;
    pthread_mutex_unlock((pthread_mutex_t *)&this->dataMutex);
    return uVar1;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

uint16_t Packet::getData() const {
    std::lock_guard<std::mutex> lock(dataMutex);
    return data;
  }